

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AStateProvider_A_CustomPunch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  AWeapon *this;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  PClass *pPVar9;
  PClassActor *pufftype;
  AInventory *this_00;
  PClassInventory *pPVar10;
  FSoundID *sound_id;
  AActor *t1;
  TArray<VMValue,_VMValue> *pTVar11;
  char *pcVar12;
  int max;
  bool bVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int actualdamage;
  FTranslatedLineTarget t;
  uint local_e0;
  int local_dc;
  _func_int **local_d8;
  PClassInventory *local_d0;
  int local_c4;
  void *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  AActor *local_a8;
  PClassActor *local_a0;
  FSoundID local_98;
  FSoundID local_94;
  FSoundID local_90;
  FName local_8c;
  FTranslatedLineTarget local_88;
  undefined1 local_68 [32];
  DAngle local_48;
  DThinker *local_40;
  AActor *local_38;
  
  pPVar9 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003ceda6:
    pcVar12 = "(paramnum) < numparam";
    goto LAB_003cedf4;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    t1 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (t1 == (AActor *)0x0) {
LAB_003ce692:
        t1 = (AActor *)0x0;
        pTVar11 = defaultparam;
        uVar6 = numparam;
      }
      else {
        pPVar8 = (t1->super_DThinker).super_DObject.Class;
        if (pPVar8 == (PClass *)0x0) {
          iVar5 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
          pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
          (t1->super_DThinker).super_DObject.Class = pPVar8;
        }
        bVar13 = pPVar8 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar13;
        bVar14 = pPVar8 == pPVar9;
        if (!bVar14 && !bVar13) {
          do {
            pPVar8 = pPVar8->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
            if (pPVar8 == pPVar9) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        pTVar11 = (TArray<VMValue,_VMValue> *)(ulong)(bVar14 || bVar13);
        uVar6 = (uint)bVar13;
        if ((char)ret == '\0') {
          pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003cedf4;
        }
      }
      pPVar9 = AStateProvider::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_003ceda6;
      if (param[1].field_0.field_3.Type == '\x03') {
        puVar3 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar3 != (undefined8 *)0x0) {
            pPVar8 = (PClass *)puVar3[1];
            if (pPVar8 == (PClass *)0x0) {
              pPVar8 = (PClass *)(**(code **)*puVar3)(puVar3,pTVar11,uVar6,ret);
              puVar3[1] = pPVar8;
            }
            bVar13 = pPVar8 != (PClass *)0x0;
            if (pPVar8 != pPVar9 && bVar13) {
              do {
                pPVar8 = pPVar8->ParentClass;
                bVar13 = pPVar8 != (PClass *)0x0;
                if (pPVar8 == pPVar9) break;
              } while (pPVar8 != (PClass *)0x0);
            }
            if (!bVar13) {
              pcVar12 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
              goto LAB_003cedf4;
            }
          }
        }
        else if (puVar3 != (undefined8 *)0x0) goto LAB_003ced9d;
        if (numparam < 3) goto LAB_003ceda6;
        if (param[2].field_0.field_3.Type != '\x03') {
          pcVar12 = "param[paramnum].Type == REGT_POINTER";
          goto LAB_003cedf4;
        }
        if (numparam == 3) {
          pcVar12 = "(paramnum) < numparam";
LAB_003cee1c:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x817,
                        "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (param[3].field_0.field_3.Type != '\0') {
          pcVar12 = "param[paramnum].Type == REGT_INT";
          goto LAB_003cee1c;
        }
        pvVar4 = param[2].field_0.field_1.a;
        iVar5 = param[3].field_0.i;
        if ((uint)numparam < 5) {
          param = defaultparam->Array;
          if (param[4].field_0.field_3.Type != '\0') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
            goto LAB_003ceee8;
          }
          bVar13 = param[4].field_0.i == 0;
LAB_003ce78a:
          if (param[5].field_0.field_3.Type != '\0') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cef07:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x819,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_e0 = param[5].field_0.i;
LAB_003ce79d:
          if (param[6].field_0.field_3.Type != '\x03') {
LAB_003cedce:
            pcVar12 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003cedd5:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81a,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_a0 = (PClassActor *)param[6].field_0.field_1.a;
          if (param[6].field_0.field_1.atag != 1) {
            if (local_a0 != (PClassActor *)0x0) goto LAB_003cedce;
            local_a0 = (PClassActor *)0x0;
          }
LAB_003ce7be:
          if (param[7].field_0.field_3.Type != '\x01') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003ceeb7:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81b,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          uVar15 = (undefined4)*(undefined8 *)&param[7].field_0;
          uVar16 = (undefined4)((ulong)*(undefined8 *)&param[7].field_0 >> 0x20);
LAB_003ce7cf:
          if (param[8].field_0.field_3.Type != '\x01') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003cee98:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81c,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_c0 = param[8].field_0.field_1.a;
LAB_003ce7e6:
          if (param[9].field_0.field_3.Type != '\0') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cee79:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81d,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          max = param[9].field_0.i;
LAB_003ce7fb:
          if (param[10].field_0.field_3.Type != '\x03') {
LAB_003cedaf:
            pcVar12 = 
            "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
            ;
LAB_003cedb6:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81e,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_d0 = (PClassInventory *)param[10].field_0.field_1.a;
          if (param[10].field_0.field_1.atag != 1) {
            if (local_d0 != (PClassInventory *)0x0) goto LAB_003cedaf;
            local_d0 = (PClassInventory *)0x0;
          }
LAB_003ce826:
          if (param[0xb].field_0.field_3.Type != '\0') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cee5a:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x81f,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_c4 = param[0xb].field_0.i;
LAB_003ce83b:
          if (param[0xc].field_0.field_3.Type != '\0') {
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cee3b:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x820,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          if (param[4].field_0.field_3.Type != '\0') {
            pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_003ceee8:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x818,
                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          bVar13 = param[4].field_0.i == 0;
          if (numparam == 5) {
            param = defaultparam->Array;
            goto LAB_003ce78a;
          }
          if (param[5].field_0.field_3.Type != '\0') {
            pcVar12 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003cef07;
          }
          local_e0 = param[5].field_0.i;
          if ((uint)numparam < 7) {
            param = defaultparam->Array;
            goto LAB_003ce79d;
          }
          if ((param[6].field_0.field_3.Type != '\x03') ||
             (local_a0 = (PClassActor *)param[6].field_0.field_1.a,
             local_a0 != (PClassActor *)0x0 && param[6].field_0.field_1.atag != 1)) {
            pcVar12 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003cedd5;
          }
          if (numparam == 7) {
            param = defaultparam->Array;
            goto LAB_003ce7be;
          }
          if (param[7].field_0.field_3.Type != '\x01') {
            pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003ceeb7;
          }
          uVar15 = (undefined4)*(undefined8 *)&param[7].field_0;
          uVar16 = (undefined4)((ulong)*(undefined8 *)&param[7].field_0 >> 0x20);
          if ((uint)numparam < 9) {
            param = defaultparam->Array;
            goto LAB_003ce7cf;
          }
          if (param[8].field_0.field_3.Type != '\x01') {
            pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
            goto LAB_003cee98;
          }
          local_c0 = param[8].field_0.field_1.a;
          if (numparam == 9) {
            param = defaultparam->Array;
            goto LAB_003ce7e6;
          }
          if (param[9].field_0.field_3.Type != '\0') {
            pcVar12 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003cee79;
          }
          max = param[9].field_0.i;
          if ((uint)numparam < 0xb) {
            param = defaultparam->Array;
            goto LAB_003ce7fb;
          }
          if ((param[10].field_0.field_3.Type != '\x03') ||
             (local_d0 = (PClassInventory *)param[10].field_0.field_1.a,
             local_d0 != (PClassInventory *)0x0 && param[10].field_0.field_1.atag != 1)) {
            pcVar12 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
            goto LAB_003cedb6;
          }
          if (numparam == 0xb) {
            param = defaultparam->Array;
            goto LAB_003ce826;
          }
          if (param[0xb].field_0.field_3.Type != '\0') {
            pcVar12 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003cee5a;
          }
          local_c4 = param[0xb].field_0.i;
          if ((uint)numparam < 0xd) {
            param = defaultparam->Array;
            goto LAB_003ce83b;
          }
          if (param[0xc].field_0.field_3.Type != '\0') {
            pcVar12 = "(param[paramnum]).Type == REGT_INT";
            goto LAB_003cee3b;
          }
        }
        if (t1->player == (player_t *)0x0) {
          return 0;
        }
        local_b8 = (double)CONCAT44(uVar16,uVar15);
        uStack_b0 = 0;
        iVar2 = param[0xc].field_0.i;
        this = t1->player->ReadyWeapon;
        if (bVar13) {
          uVar6 = FRandom::GenRand32(&pr_cwpunch);
          iVar5 = iVar5 * ((uVar6 & 7) + 1);
        }
        uVar6 = FRandom::GenRand32(&pr_cwpunch);
        uVar7 = FRandom::GenRand32(&pr_cwpunch);
        local_a8 = (AActor *)
                   ((double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.02197265625 +
                   (t1->Angles).Yaw.Degrees);
        local_b8 = (double)(~-(ulong)(local_b8 == 0.0) & (ulong)local_b8 |
                           -(ulong)(local_b8 == 0.0) & 0x4050000000000000);
        local_40 = (DThinker *)0x0;
        local_38 = local_a8;
        P_AimLineAttack((AActor *)local_68,(DAngle *)t1,local_b8,(FTranslatedLineTarget *)&local_38,
                        (DAngle *)&local_88,(int)&local_40,(AActor *)0x0,(AActor *)0x0);
        uVar15 = (undefined4)local_68._0_8_;
        uVar16 = SUB84(local_68._0_8_,4);
        if (((((local_e0 & 1) != 0) && (local_88.linetarget != (AActor *)0x0)) &&
            (this != (AWeapon *)0x0)) &&
           ((pvVar4 != (void *)0x0 && t1->player != (player_t *)0x0 &&
            (*(int *)((long)pvVar4 + 8) == 1)))) {
          local_d8 = (_func_int **)local_68._0_8_;
          bVar13 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1);
          uVar15 = SUB84(local_d8,0);
          uVar16 = (undefined4)((ulong)local_d8 >> 0x20);
          if (!bVar13) {
            return 0;
          }
        }
        pufftype = local_a0;
        if (local_a0 == (PClassActor *)0x0) {
          local_68._0_4_ = 0x40;
          local_d8 = (_func_int **)CONCAT44(uVar16,uVar15);
          pPVar9 = PClass::FindClass((FName *)local_68);
          pufftype = dyn_cast<PClassActor>((DObject *)pPVar9);
          uVar15 = SUB84(local_d8,0);
          uVar16 = (undefined4)((ulong)local_d8 >> 0x20);
        }
        local_48.Degrees = (double)local_a8;
        local_68._24_8_ = CONCAT44(uVar16,uVar15);
        local_8c.Index = 0x89;
        P_LineAttack(t1,&local_48,local_b8,(DAngle *)(local_68 + 0x18),iVar5,&local_8c,pufftype,
                     (local_e0 >> 2 & 2) + 1,&local_88,&local_dc);
        if (local_88.linetarget == (AActor *)0x0) {
          if (iVar2 == 0) {
            return 0;
          }
          local_90.ID = iVar2;
          S_Sound(t1,1,&local_90,1.0,1.0);
          return 0;
        }
        if ((0.0 < (double)local_c0) && ((((local_88.linetarget)->flags5).Value & 1) == 0)) {
          if ((local_e0 & 0x20) == 0) {
            P_GiveBody(t1,(int)((double)local_c0 * (double)local_dc),max);
          }
          else {
            if (local_d0 == (PClassInventory *)0x0) {
              pPVar9 = PClass::FindClass("ArmorBonus");
              local_d0 = dyn_cast<PClassInventory>((DObject *)pPVar9);
              if (local_d0 == (PClassInventory *)0x0) goto LAB_003cec6d;
            }
            pPVar10 = local_d0;
            if (local_d0 != (PClassInventory *)ABasicArmorBonus::RegistrationInfo.MyClass) {
              do {
                pPVar10 = (PClassInventory *)(pPVar10->super_PClassActor).super_PClass.ParentClass;
                if (pPVar10 == (PClassInventory *)ABasicArmorBonus::RegistrationInfo.MyClass) break;
              } while (pPVar10 != (PClassInventory *)0x0);
              if (pPVar10 == (PClassInventory *)0x0) {
                __assert_fail("armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x852,
                              "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
            }
            local_68._0_8_ = (_func_int **)0x0;
            local_68._8_8_ = (PClass *)0x0;
            local_68._16_8_ = (DObject *)0x0;
            this_00 = (AInventory *)
                      AActor::StaticSpawn(&local_d0->super_PClassActor,(DVector3 *)local_68,
                                          NO_REPLACE,false);
            *(int *)((long)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) =
                 (int)((double)local_c0 * (double)local_dc) *
                 *(int *)((long)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4);
            if (max < 1) {
              max = *(int *)&this_00[1].super_AActor.super_DThinker.super_DObject.Class;
            }
            *(int *)&this_00[1].super_AActor.super_DThinker.super_DObject.Class = max;
            pbVar1 = (byte *)((long)&(this_00->super_AActor).flags.Value + 2);
            *pbVar1 = *pbVar1 | 2;
            AActor::ClearCounters((AActor *)this_00);
            bVar13 = AInventory::CallTryPickup(this_00,t1,(AActor **)0x0);
            if (!bVar13) {
              (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this_00);
            }
          }
        }
LAB_003cec6d:
        if (this != (AWeapon *)0x0) {
          if (local_c4 == 0) {
            iVar5 = (this->super_AStateProvider).super_AInventory.super_AActor.AttackSound.
                    super_FSoundID.ID;
            sound_id = &local_98;
          }
          else {
            sound_id = &local_94;
            iVar5 = local_c4;
          }
          sound_id->ID = iVar5;
          S_Sound(t1,1,sound_id,1.0,1.0);
        }
        if ((local_e0 & 0x10) == 0) {
          (t1->Angles).Yaw.Degrees = local_88.angleFromSource.Degrees;
        }
        if ((local_e0 & 4) != 0) {
          *(byte *)&(t1->flags).Value = (byte)(t1->flags).Value | 0x80;
        }
        if ((local_e0 & 2) != 0) {
          P_DaggerAlert(t1,local_88.linetarget);
        }
        return 0;
      }
    }
    else if (t1 == (AActor *)0x0) goto LAB_003ce692;
  }
LAB_003ced9d:
  pcVar12 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003cedf4:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x816,
                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CustomPunch)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_INT		(damage);
	PARAM_BOOL_DEF	(norandom);
	PARAM_INT_DEF	(flags);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_FLOAT_DEF	(lifesteal);
	PARAM_INT_DEF	(lifestealmax);
	PARAM_CLASS_DEF	(armorbonustype, ABasicArmorBonus);
	PARAM_SOUND_DEF	(MeleeSound);
	PARAM_SOUND_DEF	(MissSound);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;


	DAngle angle;
	DAngle pitch;
	FTranslatedLineTarget t;
	int			actualdamage;

	if (!norandom)
		damage *= pr_cwpunch() % 8 + 1;

	angle = self->Angles.Yaw + pr_cwpunch.Random2() * (5.625 / 256);
	if (range == 0) range = DEFMELEERANGE;
	pitch = P_AimLineAttack (self, angle, range, &t);

	// only use ammo when actually hitting something!
	if ((flags & CPF_USEAMMO) && t.linetarget && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (pufftype == NULL)
		pufftype = PClass::FindActor(NAME_BulletPuff);
	int puffFlags = LAF_ISMELEEATTACK | ((flags & CPF_NORANDOMPUFFZ) ? LAF_NORANDOMPUFFZ : 0);

	P_LineAttack (self, angle, range, pitch, damage, NAME_Melee, pufftype, puffFlags, &t, &actualdamage);

	if (!t.linetarget)
	{
		if (MissSound) S_Sound(self, CHAN_WEAPON, MissSound, 1, ATTN_NORM);
	}
	else
	{
		if (lifesteal > 0 && !(t.linetarget->flags5 & MF5_DONTDRAIN))
		{
			if (flags & CPF_STEALARMOR)
			{
				if (armorbonustype == NULL)
				{
					armorbonustype = dyn_cast<ABasicArmorBonus::MetaClass>(PClass::FindClass("ArmorBonus"));
				}
				if (armorbonustype != NULL)
				{
					assert(armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus)));
					ABasicArmorBonus *armorbonus = static_cast<ABasicArmorBonus *>(Spawn(armorbonustype));
					armorbonus->SaveAmount *= int(actualdamage * lifesteal);
					armorbonus->MaxSaveAmount = lifestealmax <= 0 ? armorbonus->MaxSaveAmount : lifestealmax;
					armorbonus->flags |= MF_DROPPED;
					armorbonus->ClearCounters();

					if (!armorbonus->CallTryPickup(self))
					{
						armorbonus->Destroy ();
					}
				}
			}
			else
			{
				P_GiveBody (self, int(actualdamage * lifesteal), lifestealmax);
			}
		}
		if (weapon != NULL)
		{
			if (MeleeSound) S_Sound(self, CHAN_WEAPON, MeleeSound, 1, ATTN_NORM);
			else			S_Sound (self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
		}

		if (!(flags & CPF_NOTURN))
		{
			// turn to face target
			self->Angles.Yaw = t.angleFromSource;
		}

		if (flags & CPF_PULLIN) self->flags |= MF_JUSTATTACKED;
		if (flags & CPF_DAGGER) P_DaggerAlert (self, t.linetarget);
	}
	return 0;
}